

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_functions.cpp
# Opt level: O3

ir_function_signature * __thiscall
anon_unknown.dwarf_e2059::builtin_builder::_textureCubeArrayShadow
          (builtin_builder *this,ir_texture_opcode opcode,builtin_available_predicate avail,
          glsl_type *sampler_type)

{
  exec_node *peVar1;
  exec_node *peVar2;
  void *mem_ctx;
  ir_variable *piVar3;
  ir_variable *this_00;
  ir_variable *this_01;
  ir_function_signature *piVar4;
  operand retval;
  ir_dereference_variable *piVar5;
  glsl_type *this_02;
  ir_return *ir;
  char *name;
  undefined4 in_register_00000034;
  int iVar6;
  ir_factory body;
  ir_factory local_40;
  
  iVar6 = (int)this;
  piVar3 = (ir_variable *)exec_node::operator_new(0x90,builtins.mem_ctx);
  ir_variable::ir_variable(piVar3,(glsl_type *)avail,"sampler",ir_var_function_in);
  this_00 = (ir_variable *)exec_node::operator_new(0x90,builtins.mem_ctx);
  ir_variable::ir_variable(this_00,&glsl_type::_vec4_type,"P",ir_var_function_in);
  this_01 = (ir_variable *)exec_node::operator_new(0x90,builtins.mem_ctx);
  ir_variable::ir_variable(this_01,&glsl_type::_float_type,"compare",ir_var_function_in);
  piVar4 = new_sig(&builtins,&glsl_type::_float_type,
                   (builtin_available_predicate)CONCAT44(in_register_00000034,opcode),3,piVar3,
                   this_00,this_01);
  mem_ctx = builtins.mem_ctx;
  local_40.instructions = &piVar4->body;
  local_40.mem_ctx = builtins.mem_ctx;
  piVar4->field_0x48 = piVar4->field_0x48 | 1;
  retval.val = (ir_rvalue *)exec_node::operator_new(0x68,mem_ctx);
  ir_rvalue::ir_rvalue(retval.val,ir_type_texture);
  ((retval.val)->super_ir_instruction)._vptr_ir_instruction =
       (_func_int **)&PTR__ir_instruction_0025c098;
  *(int *)&retval.val[1].super_ir_instruction._vptr_ir_instruction = iVar6;
  retval.val[1].super_ir_instruction.super_exec_node.next = (exec_node *)0x0;
  retval.val[1].super_ir_instruction.super_exec_node.prev = (exec_node *)0x0;
  *(undefined8 *)&retval.val[1].super_ir_instruction.ir_type = 0;
  retval.val[1].type = (glsl_type *)0x0;
  retval.val[2].super_ir_instruction._vptr_ir_instruction = (_func_int **)0x0;
  retval.val[2].super_ir_instruction.super_exec_node.next = (exec_node *)0x0;
  retval.val[2].super_ir_instruction.super_exec_node.prev = (exec_node *)0x0;
  piVar5 = (ir_dereference_variable *)exec_node::operator_new(0x30,builtins.mem_ctx);
  ir_dereference_variable::ir_dereference_variable(piVar5,piVar3);
  ir_texture::set_sampler((ir_texture *)retval.val,(ir_dereference *)piVar5,&glsl_type::_float_type)
  ;
  piVar5 = (ir_dereference_variable *)exec_node::operator_new(0x30,builtins.mem_ctx);
  ir_dereference_variable::ir_dereference_variable(piVar5,this_00);
  retval.val[1].super_ir_instruction.super_exec_node.prev = (exec_node *)piVar5;
  this_02 = (glsl_type *)exec_node::operator_new(0x30,builtins.mem_ctx);
  ir_dereference_variable::ir_dereference_variable((ir_dereference_variable *)this_02,this_01);
  retval.val[1].type = this_02;
  if (iVar6 == 1) {
    name = "bias";
  }
  else {
    if (iVar6 != 2) goto LAB_001bfc3d;
    name = "lod";
  }
  piVar3 = (ir_variable *)exec_node::operator_new(0x90,builtins.mem_ctx);
  ir_variable::ir_variable(piVar3,&glsl_type::_float_type,name,ir_var_function_in);
  peVar1 = &(piVar3->super_ir_instruction).super_exec_node;
  (piVar3->super_ir_instruction).super_exec_node.next = &(piVar4->parameters).tail_sentinel;
  peVar2 = (piVar4->parameters).tail_sentinel.prev;
  (piVar3->super_ir_instruction).super_exec_node.prev = peVar2;
  peVar2->next = peVar1;
  (piVar4->parameters).tail_sentinel.prev = peVar1;
  piVar5 = (ir_dereference_variable *)exec_node::operator_new(0x30,builtins.mem_ctx);
  ir_dereference_variable::ir_dereference_variable(piVar5,piVar3);
  retval.val[2].super_ir_instruction.super_exec_node.next = (exec_node *)piVar5;
LAB_001bfc3d:
  ir = ir_builder::ret(retval);
  ir_builder::ir_factory::emit(&local_40,(ir_instruction *)ir);
  return piVar4;
}

Assistant:

ir_function_signature *
builtin_builder::_textureCubeArrayShadow(ir_texture_opcode opcode,
                                         builtin_available_predicate avail,
                                         const glsl_type *sampler_type)
{
   ir_variable *s = in_var(sampler_type, "sampler");
   ir_variable *P = in_var(glsl_type::vec4_type, "P");
   ir_variable *compare = in_var(glsl_type::float_type, "compare");
   MAKE_SIG(glsl_type::float_type, avail, 3, s, P, compare);

   ir_texture *tex = new(mem_ctx) ir_texture(opcode);
   tex->set_sampler(var_ref(s), glsl_type::float_type);

   tex->coordinate = var_ref(P);
   tex->shadow_comparator = var_ref(compare);

   if (opcode == ir_txb) {
      ir_variable *bias = in_var(glsl_type::float_type, "bias");
      sig->parameters.push_tail(bias);
      tex->lod_info.bias = var_ref(bias);
   }

   if (opcode == ir_txl) {
      ir_variable *lod = in_var(glsl_type::float_type, "lod");
      sig->parameters.push_tail(lod);
      tex->lod_info.lod = var_ref(lod);
   }

   body.emit(ret(tex));

   return sig;
}